

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * GetQuote(ConfigScanner *sc)

{
  bool bVar1;
  byte bVar2;
  char *__s;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  byte *__src;
  byte *pbVar6;
  
  if (sc != (ConfigScanner *)0x0) {
    __src = (byte *)sc->ptr;
    pbVar6 = __src;
    do {
      bVar2 = *pbVar6;
      iVar4 = 1;
      if (bVar2 < 0xd) {
        if ((bVar2 != 0) && (bVar2 != 10)) goto LAB_001427e8;
      }
      else if (bVar2 != 0xd) {
        if (bVar2 == 0x5c) {
          sc->ptr = (char *)(pbVar6 + 1);
          bVar2 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        }
        else if (bVar2 == 0x22) {
          iVar4 = 3;
          goto LAB_001427fe;
        }
LAB_001427e8:
        sVar3 = GetUTF8Length(bVar2);
        if (sVar3 != 0) {
          pbVar6 = pbVar6 + sVar3;
          sc->ptr = (char *)pbVar6;
          iVar4 = 0;
        }
      }
LAB_001427fe:
    } while (iVar4 == 0);
    if (iVar4 == 3) {
      pcVar5 = sc->ptr;
      __s = (char *)malloc((size_t)(pcVar5 + (1 - (long)__src)));
      memset(__s,0,(size_t)(pcVar5 + (1 - (long)__src)));
      pcVar5 = __s;
      do {
        bVar2 = *__src;
        if (bVar2 == 0x22) {
          bVar1 = false;
        }
        else {
          if (bVar2 == 0x5c) {
            bVar2 = __src[1];
            __src = __src + 1;
          }
          sVar3 = GetUTF8Length(bVar2);
          memcpy(pcVar5,__src,sVar3);
          __src = __src + sVar3;
          pcVar5 = pcVar5 + sVar3;
          bVar1 = true;
        }
      } while (bVar1);
      if (*sc->ptr != '\"') {
        return __s;
      }
      sc->ptr = sc->ptr + 1;
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

char *GetQuote(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			return NULL;
		}
		else if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++sc->ptr;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	char *s = start;
	char *d = temp;
	while (true)
	{
		char ch = *s;
		if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++s;
		}
		size_t step = GetUTF8Length(ch);
		memcpy(d, s, step);
		s += step;
		d += step;
	}
	if (*sc->ptr == '"')
	{
		sc->ptr++;
	}
	return temp;
}